

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  Mat *this_00;
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  Option opt_q;
  Mat local_158;
  Mat local_108;
  Mat local_b8;
  Option local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_158,mb,(ulong)(uint)this->weight_data_size,0);
  this_00 = &this->weight_data;
  if (this_00 != &local_158) {
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + 1;
      UNLOCK();
    }
    piVar2 = (this->weight_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->weight_data).data;
        pAVar4 = (this->weight_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).cstep = 0;
    *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->weight_data).refcount = (int *)0x0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).d = 0;
    (this->weight_data).c = 0;
    (this->weight_data).data = local_158.data;
    (this->weight_data).refcount = local_158.refcount;
    (this->weight_data).elemsize = local_158.elemsize;
    (this->weight_data).elempack = local_158.elempack;
    (this->weight_data).allocator = local_158.allocator;
    (this->weight_data).dims = local_158.dims;
    (this->weight_data).w = local_158.w;
    (this->weight_data).h = local_158.h;
    (this->weight_data).d = local_158.d;
    (this->weight_data).c = local_158.c;
    (this->weight_data).cstep = local_158.cstep;
  }
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar5 = -100;
  if ((this_00->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (*mb->_vptr_ModelBin[2])(&local_158,mb,(ulong)(uint)this->num_output,1);
      pMVar1 = &this->bias_data;
      if (pMVar1 != &local_158) {
        if (local_158.refcount != (int *)0x0) {
          LOCK();
          *local_158.refcount = *local_158.refcount + 1;
          UNLOCK();
        }
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->bias_data).data;
            pAVar4 = (this->bias_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->bias_data).cstep = 0;
        *(undefined8 *)((long)&(this->bias_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->bias_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->bias_data).refcount = (int *)0x0;
        (this->bias_data).dims = 0;
        (this->bias_data).w = 0;
        (this->bias_data).h = 0;
        (this->bias_data).d = 0;
        (this->bias_data).c = 0;
        (this->bias_data).data = local_158.data;
        (this->bias_data).refcount = local_158.refcount;
        (this->bias_data).elemsize = local_158.elemsize;
        (this->bias_data).elempack = local_158.elempack;
        (this->bias_data).allocator = local_158.allocator;
        (this->bias_data).dims = local_158.dims;
        (this->bias_data).w = local_158.w;
        (this->bias_data).h = local_158.h;
        (this->bias_data).d = local_158.d;
        (this->bias_data).c = local_158.c;
        (this->bias_data).cstep = local_158.cstep;
      }
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (*local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (pMVar1->data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term != 0) {
      (*mb->_vptr_ModelBin[2])(&local_158,mb,(ulong)(uint)this->num_output,1);
      if (&this->weight_data_int8_scales != &local_158) {
        if (local_158.refcount != (int *)0x0) {
          LOCK();
          *local_158.refcount = *local_158.refcount + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_data_int8_scales).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->weight_data_int8_scales).data;
            pAVar4 = (this->weight_data_int8_scales).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_int8_scales).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_int8_scales).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_int8_scales).elemsize + 4) = 0;
        (this->weight_data_int8_scales).data = (void *)0x0;
        (this->weight_data_int8_scales).refcount = (int *)0x0;
        (this->weight_data_int8_scales).dims = 0;
        (this->weight_data_int8_scales).w = 0;
        (this->weight_data_int8_scales).h = 0;
        (this->weight_data_int8_scales).d = 0;
        (this->weight_data_int8_scales).c = 0;
        (this->weight_data_int8_scales).data = local_158.data;
        (this->weight_data_int8_scales).refcount = local_158.refcount;
        (this->weight_data_int8_scales).elemsize = local_158.elemsize;
        (this->weight_data_int8_scales).elempack = local_158.elempack;
        (this->weight_data_int8_scales).allocator = local_158.allocator;
        (this->weight_data_int8_scales).dims = local_158.dims;
        (this->weight_data_int8_scales).w = local_158.w;
        (this->weight_data_int8_scales).h = local_158.h;
        (this->weight_data_int8_scales).d = local_158.d;
        (this->weight_data_int8_scales).c = local_158.c;
        (this->weight_data_int8_scales).cstep = local_158.cstep;
      }
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (*local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*mb->_vptr_ModelBin[2])(&local_158,mb,1,1);
      if (&this->bottom_blob_int8_scales != &local_158) {
        if (local_158.refcount != (int *)0x0) {
          LOCK();
          *local_158.refcount = *local_158.refcount + 1;
          UNLOCK();
        }
        piVar2 = (this->bottom_blob_int8_scales).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->bottom_blob_int8_scales).data;
            pAVar4 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->bottom_blob_int8_scales).cstep = 0;
        *(undefined8 *)((long)&(this->bottom_blob_int8_scales).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->bottom_blob_int8_scales).elemsize + 4) = 0;
        (this->bottom_blob_int8_scales).data = (void *)0x0;
        (this->bottom_blob_int8_scales).refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).d = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = local_158.data;
        (this->bottom_blob_int8_scales).refcount = local_158.refcount;
        (this->bottom_blob_int8_scales).elemsize = local_158.elemsize;
        (this->bottom_blob_int8_scales).elempack = local_158.elempack;
        (this->bottom_blob_int8_scales).allocator = local_158.allocator;
        (this->bottom_blob_int8_scales).dims = local_158.dims;
        (this->bottom_blob_int8_scales).w = local_158.w;
        (this->bottom_blob_int8_scales).h = local_158.h;
        (this->bottom_blob_int8_scales).d = local_158.d;
        (this->bottom_blob_int8_scales).c = local_158.c;
        (this->bottom_blob_int8_scales).cstep = local_158.cstep;
      }
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (*local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (((this->weight_data).elemsize == 4) && (this->int8_scale_term != 0)) {
      Mat::reshape(&local_158,this_00,this->weight_data_size / this->num_output,this->num_output,
                   (Allocator *)0x0);
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8._20_8_ = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      Option::Option(&local_70);
      local_70.num_threads = 1;
      local_70.use_packing_layout = false;
      quantize_to_int8(&local_158,&local_b8,&this->weight_data_int8_scales,&local_70);
      bVar6 = local_b8.data == (void *)0x0;
      bVar7 = (long)local_b8.c * local_b8.cstep == 0;
      if (!bVar6 && !bVar7) {
        Mat::reshape(&local_108,&local_b8,this->weight_data_size,(Allocator *)0x0);
        if (this_00 != &local_108) {
          if (local_108.refcount != (int *)0x0) {
            LOCK();
            *local_108.refcount = *local_108.refcount + 1;
            UNLOCK();
          }
          piVar2 = (this->weight_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = (this->weight_data).data;
              pAVar4 = (this->weight_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data).cstep = 0;
          *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
          this_00->data = (void *)0x0;
          (this->weight_data).refcount = (int *)0x0;
          (this->weight_data).dims = 0;
          (this->weight_data).w = 0;
          (this->weight_data).h = 0;
          (this->weight_data).d = 0;
          (this->weight_data).c = 0;
          (this->weight_data).data = local_108.data;
          (this->weight_data).refcount = local_108.refcount;
          (this->weight_data).elemsize = local_108.elemsize;
          (this->weight_data).elempack = local_108.elempack;
          (this->weight_data).allocator = local_108.allocator;
          (this->weight_data).dims = local_108.dims;
          (this->weight_data).w = local_108.w;
          (this->weight_data).h = local_108.h;
          (this->weight_data).d = local_108.d;
          (this->weight_data).c = local_108.c;
          (this->weight_data).cstep = local_108.cstep;
        }
        if (local_108.refcount != (int *)0x0) {
          LOCK();
          *local_108.refcount = *local_108.refcount + -1;
          UNLOCK();
          if (*local_108.refcount == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if (local_108.data != (void *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8._20_8_ = 0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (*local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (bVar6 || bVar7) {
        return -100;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int num_input = weight_data_size / num_output;

        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        Mat weight_data_int8;
        Option opt_q;
        opt_q.num_threads = 1;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}